

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_ssub_s8(c_v64 a,c_v64 b)

{
  uint8_t uVar1;
  short sVar2;
  int16_t d;
  int c;
  c_v64 b_local;
  c_v64 a_local;
  c_v64 t;
  
  a_local = a;
  b_local = b;
  for (c = 0; c < 8; c = c + 1) {
    sVar2 = (short)a_local.s8[c] - (short)b_local.s8[c];
    if (sVar2 < 0x80) {
      if (sVar2 < -0x80) {
        sVar2 = -0x80;
      }
      uVar1 = (uint8_t)sVar2;
    }
    else {
      uVar1 = '\x7f';
    }
    t.u8[c] = uVar1;
  }
  return (c_v64)t.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_ssub_s8(c_v64 a, c_v64 b) {
  c_v64 t;
  int c;
  for (c = 0; c < 8; c++) {
    int16_t d = (int16_t)a.s8[c] - (int16_t)b.s8[c];
    t.s8[c] = SIMD_CLAMP(d, -128, 127);
  }
  return t;
}